

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCMaterial.cpp
# Opt level: O0

uint Assimp::IFC::ProcessMaterials
               (uint64_t id,uint prevMatId,ConversionData *conv,bool forceDefaultMat)

{
  DB *this;
  bool bVar1;
  mapped_type mVar2;
  uint uVar3;
  uint uVar4;
  RefMap *this_00;
  reference ppVar5;
  LazyObject *this_01;
  IfcStyledItem *pIVar6;
  undefined1 *puVar7;
  Lazy *this_02;
  IfcPresentationStyleAssignment *pIVar8;
  reference psVar9;
  element_type *this_03;
  pointer ppVar10;
  mapped_type *pmVar11;
  size_type sVar12;
  reference ppaVar13;
  aiMaterial *paVar14;
  pointer paVar15;
  pointer local_ac0;
  undefined1 local_ab8 [8];
  aiColor4D col;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  aiString mname;
  size_t a;
  aiString name;
  uint matindex;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> local_280;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat_1;
  format local_258;
  undefined1 local_e0 [8];
  string side;
  _Self local_b8;
  _Self local_b0;
  iterator mit;
  IfcSurfaceStyle *local_98;
  IfcSurfaceStyle *surf;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> sel;
  const_iterator __end5;
  const_iterator __begin5;
  Out *__range5;
  IfcPresentationStyleAssignment *as;
  const_iterator __end4;
  const_iterator __begin4;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_1UL,_0UL>
  *__range4;
  IfcStyledItem *styled;
  RefMapRange range;
  bool forceDefaultMat_local;
  ConversionData *conv_local;
  uint64_t uStack_18;
  uint prevMatId_local;
  uint64_t id_local;
  
  range.second._M_node._7_1_ = forceDefaultMat;
  uStack_18 = id;
  this_00 = STEP::DB::GetRefs(conv->db);
  _styled = std::
            multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::equal_range(this_00,&stack0xffffffffffffffe8);
  do {
    bVar1 = std::operator!=((_Self *)&styled,&range.first);
    if (!bVar1) {
      uVar3 = std::numeric_limits<unsigned_int>::max();
      uVar4 = prevMatId;
      if (prevMatId == uVar3) {
        if ((range.second._M_node._7_1_ & 1) == 0) {
          uVar4 = std::numeric_limits<unsigned_int>::max();
        }
        else {
          aiString::aiString((aiString *)&a);
          aiString::Set((aiString *)&a,"<IFCDefault>");
          mname.data[0x3f8] = '\0';
          mname.data[0x3f9] = '\0';
          mname.data[0x3fa] = '\0';
          mname.data[0x3fb] = '\0';
          mname.data[0x3fc] = '\0';
          mname.data[0x3fd] = '\0';
          mname.data[0x3fe] = '\0';
          mname.data[0x3ff] = '\0';
          for (; sVar12 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                                    (&conv->materials), (ulong)mname.data._1016_8_ < sVar12;
              mname.data._1016_8_ = mname.data._1016_8_ + 1) {
            aiString::aiString((aiString *)
                               ((long)&mat._M_t.
                                       super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl + 4)
                              );
            ppaVar13 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                                 (&conv->materials,mname.data._1016_8_);
            aiMaterial::Get(*ppaVar13,"?mat.name",0,0,
                            (aiString *)
                            ((long)&mat._M_t.
                                    super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                    .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl + 4));
            bVar1 = aiString::operator==
                              ((aiString *)&a,
                               (aiString *)
                               ((long)&mat._M_t.
                                       super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl + 4)
                              );
            if (bVar1) {
              return mname.data._1016_4_;
            }
          }
          paVar14 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(paVar14);
          std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>::
          unique_ptr<std::default_delete<aiMaterial>,void>
                    ((unique_ptr<aiMaterial,std::default_delete<aiMaterial>> *)&col.b,paVar14);
          paVar15 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                              ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&col.b);
          aiMaterial::AddProperty(paVar15,(aiString *)&a,"?mat.name",0,0);
          aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_ab8,0.6,0.6,0.6,1.0);
          paVar15 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                              ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&col.b);
          aiMaterial::AddProperty(paVar15,(aiColor4D *)local_ab8,1,"$clr.diffuse",0,0);
          local_ac0 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::release
                                ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&col.b)
          ;
          std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                    (&conv->materials,&local_ac0);
          sVar12 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&conv->materials);
          id_local._4_4_ = (int)sVar12 - 1;
          side.field_2._12_4_ = 1;
          std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
                    ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&col.b);
          uVar4 = id_local._4_4_;
        }
      }
      id_local._4_4_ = uVar4;
      return id_local._4_4_;
    }
    this = conv->db;
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                        &styled);
    this_01 = STEP::DB::GetObject(this,ppVar5->second);
    pIVar6 = STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcStyledItem>(this_01);
    if (pIVar6 != (IfcStyledItem *)0x0) {
      puVar7 = &(pIVar6->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x20
      ;
      __end4 = std::
               vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_>_>
               ::begin((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_>_>
                        *)puVar7);
      as = (IfcPresentationStyleAssignment *)
           std::
           vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_>_>
           ::end((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_>_>
                  *)puVar7);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_>_>_>
                                         *)&as), bVar1) {
        this_02 = (Lazy *)__gnu_cxx::
                          __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_>_>_>
                          ::operator*(&__end4);
        pIVar8 = STEP::Lazy::operator_cast_to_IfcPresentationStyleAssignment_(this_02);
        puVar7 = &(pIVar8->
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>).
                  field_0x10;
        __end5 = std::
                 vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                 ::begin((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                          *)puVar7);
        sel.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ::end((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                    *)puVar7);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
                                           *)&sel.
                                              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount), bVar1) {
          psVar9 = __gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
                   ::operator*(&__end5);
          std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr
                    ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&surf,psVar9);
          this_03 = std::
                    __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&surf);
          local_98 = STEP::EXPRESS::DataType::
                     ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyle>(this_03,conv->db);
          if (local_98 == (IfcSurfaceStyle *)0x0) {
            side.field_2._12_4_ = 0;
          }
          else {
            local_b0._M_node =
                 (_Base_ptr)
                 std::
                 map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                 ::find(&conv->cached_materials,&local_98);
            local_b8._M_node =
                 (_Base_ptr)
                 std::
                 map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                 ::end(&conv->cached_materials);
            bVar1 = std::operator!=(&local_b0,&local_b8);
            if (bVar1) {
              ppVar10 = std::
                        _Rb_tree_iterator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>
                        ::operator->(&local_b0);
              id_local._4_4_ = ppVar10->second;
              side.field_2._12_4_ = 1;
            }
            else {
              std::__cxx11::string::string
                        ((string *)local_e0,
                         (string *)&(local_98->super_IfcPresentationStyle).field_0x48);
              bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_e0,"BOTH");
              if (bVar1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &mat_1,"ignoring surface side marker on IFC::IfcSurfaceStyle: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e0);
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                basic_formatter<std::__cxx11::string>
                          ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_258,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &mat_1);
                LogFunctions<Assimp::IFCImporter>::LogWarn(&local_258);
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                ~basic_formatter(&local_258);
                std::__cxx11::string::~string((string *)&mat_1);
              }
              paVar14 = (aiMaterial *)operator_new(0x10);
              aiMaterial::aiMaterial(paVar14);
              std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>::
              unique_ptr<std::default_delete<aiMaterial>,void>
                        ((unique_ptr<aiMaterial,std::default_delete<aiMaterial>> *)&local_280,
                         paVar14);
              paVar15 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::get
                                  (&local_280);
              FillMaterial(paVar15,local_98,conv);
              register0x00000000 =
                   std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::release
                             (&local_280);
              std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                        (&conv->materials,(value_type *)(name.data + 0x3fc));
              sVar12 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                                 (&conv->materials);
              mVar2 = (int)sVar12 - 1;
              name.data._1016_4_ = mVar2;
              pmVar11 = std::
                        map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                        ::operator[](&conv->cached_materials,&local_98);
              *pmVar11 = mVar2;
              id_local._4_1_ = name.data[0x3f8];
              id_local._5_1_ = name.data[0x3f9];
              id_local._6_1_ = name.data[0x3fa];
              id_local._7_1_ = name.data[0x3fb];
              side.field_2._12_4_ = 1;
              std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr(&local_280)
              ;
              std::__cxx11::string::~string((string *)local_e0);
            }
          }
          std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
                    ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&surf);
          if (side.field_2._12_4_ != 0) {
            return id_local._4_4_;
          }
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
          ::operator++(&__end5);
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>_>_>_>
        ::operator++(&__end4);
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)&styled);
  } while( true );
}

Assistant:

unsigned int ProcessMaterials(uint64_t id, unsigned int prevMatId, ConversionData& conv, bool forceDefaultMat) {
    STEP::DB::RefMapRange range = conv.db.GetRefs().equal_range(id);
    for(;range.first != range.second; ++range.first) {
        if(const IFC::Schema_2x3::IfcStyledItem* const styled = conv.db.GetObject((*range.first).second)->ToPtr<IFC::Schema_2x3::IfcStyledItem>()) {
            for(const IFC::Schema_2x3::IfcPresentationStyleAssignment& as : styled->Styles) {
                for(std::shared_ptr<const IFC::Schema_2x3::IfcPresentationStyleSelect> sel : as.Styles) {

                    if( const IFC::Schema_2x3::IfcSurfaceStyle* const surf = sel->ResolveSelectPtr<IFC::Schema_2x3::IfcSurfaceStyle>(conv.db) ) {
                        // try to satisfy from cache
                        ConversionData::MaterialCache::iterator mit = conv.cached_materials.find(surf);
                        if( mit != conv.cached_materials.end() )
                            return mit->second;

                        // not found, create new material
                        const std::string side = static_cast<std::string>(surf->Side);
                        if( side != "BOTH" ) {
                            IFCImporter::LogWarn("ignoring surface side marker on IFC::IfcSurfaceStyle: " + side);
                        }

                        std::unique_ptr<aiMaterial> mat(new aiMaterial());

                        FillMaterial(mat.get(), surf, conv);

                        conv.materials.push_back(mat.release());
                        unsigned int matindex = static_cast<unsigned int>(conv.materials.size() - 1);
                        conv.cached_materials[surf] = matindex;
                        return matindex;
                    }
                }
            }
        }
    }

    // no local material defined. If there's global one, use that instead
    if ( prevMatId != std::numeric_limits<uint32_t>::max() ) {
        return prevMatId;
    }

    // we're still here - create an default material if required, or simply fail otherwise
    if ( !forceDefaultMat ) {
        return std::numeric_limits<uint32_t>::max();
    }

    aiString name;
    name.Set("<IFCDefault>");
    //  ConvertColorToString( color, name);

    // look if there's already a default material with this base color
    for( size_t a = 0; a < conv.materials.size(); ++a ) {
        aiString mname;
        conv.materials[a]->Get(AI_MATKEY_NAME, mname);
        if ( name == mname ) {
            return ( unsigned int )a;
        }
    }

    // we're here, yet - no default material with suitable color available. Generate one
    std::unique_ptr<aiMaterial> mat(new aiMaterial());
    mat->AddProperty(&name,AI_MATKEY_NAME);

    const aiColor4D col = aiColor4D( 0.6f, 0.6f, 0.6f, 1.0f); // aiColor4D( color.r, color.g, color.b, 1.0f);
    mat->AddProperty(&col,1, AI_MATKEY_COLOR_DIFFUSE);

    conv.materials.push_back(mat.release());
    return (unsigned int) conv.materials.size() - 1;
}